

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::SwapChainVkImpl::CreateVulkanSwapChain(SwapChainVkImpl *this)

{
  Uint32 *pUVar1;
  uint *puVar2;
  uint uVar3;
  VkPhysicalDevice pVVar4;
  VkSwapchainKHR pVVar5;
  VkDevice pVVar6;
  pointer pRVar7;
  uint uVar8;
  pointer pVVar9;
  TEXTURE_FORMAT Format;
  VkResult VVar10;
  VkFormat VVar11;
  VkSurfaceTransformFlagBitsKHR VVar12;
  SURFACE_TRANSFORM SVar13;
  TextureFormatAttribs *pTVar14;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  _Var15;
  ostream *poVar16;
  iterator __begin3;
  char (*Args_1) [16];
  char (*Args_1_00) [39];
  char (*Args_1_01) [21];
  char (*Args_1_02) [164];
  char (*Args_1_03) [24];
  iterator __end3;
  VkColorSpaceKHR VVar17;
  VkSurfaceFormatKHR *SrfFmt;
  pointer pVVar18;
  long lVar19;
  char *in_R8;
  char *in_R9;
  VkExtent2D VVar20;
  uint uVar21;
  pointer pVVar22;
  ulong uVar23;
  VkSurfaceCapabilitiesKHR *in_stack_fffffffffffffcd8;
  VkSurfaceCapabilitiesKHR *pVVar24;
  uint32_t swapchainImageCount;
  uint32_t formatCount;
  element_type *local_318;
  uint32_t presentModeCount;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_308;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_300;
  RenderDeviceVkImpl *local_2f8;
  string Name;
  DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  local_2d0;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> presentModes;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> PreferredPresentModes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> SupportedFormats;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  VkSemaphoreCreateInfo local_1e8;
  string msg;
  SemaphoreWrapper Semaphore;
  
  local_2f8 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  pVVar4 = ((local_2f8->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
           m_VkDevice;
  formatCount = 0;
  Args_1 = (char (*) [16])0x0;
  VVar10 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar4,this->m_VkSurface,&formatCount,(VkSurfaceFormatKHR *)0x0);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_stack_fffffffffffffcd8 = (VkSurfaceCapabilitiesKHR *)&msg;
    in_R8 = "Failed to query number of supported formats";
    in_R9 = "\nVK Error Code: ";
    Args_1 = (char (*) [16])0xac;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xac,(char (*) [44])"Failed to query number of supported formats",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffffcd8);
  }
  if (formatCount == 0) {
    FormatString<char[26],char[16]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"formatCount > 0",Args_1
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)&msg);
  }
  pVVar24 = (VkSurfaceCapabilitiesKHR *)&msg;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            (&SupportedFormats,(ulong)formatCount,(allocator_type *)pVVar24);
  VVar10 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar4,this->m_VkSurface,&formatCount,
                      SupportedFormats.
                      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_R8 = "Failed to query supported format properties";
    in_R9 = "\nVK Error Code: ";
    in_stack_fffffffffffffcd8 = pVVar24;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb0,(char (*) [44])"Failed to query supported format properties",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
  }
  Args_1_00 = (char (*) [39])
              ((long)SupportedFormats.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)SupportedFormats.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [39])(ulong)formatCount) {
    FormatString<char[26],char[39]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount == SupportedFormats.size()",Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)&msg);
  }
  VVar11 = TexFormatToVkFormat((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                               ColorBufferFormat);
  this->m_VkColorFormat = VVar11;
  pVVar18 = SupportedFormats.
            super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((formatCount != 1) ||
     ((SupportedFormats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
       _M_impl.super__Vector_impl_data._M_start)->format != VK_FORMAT_UNDEFINED)) {
    for (; pVVar18 !=
           SupportedFormats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_finish; pVVar18 = pVVar18 + 1) {
      if (pVVar18->format == VVar11) {
        VVar17 = pVVar18->colorSpace;
        goto LAB_00249415;
      }
    }
    if (VVar11 == VK_FORMAT_R8G8B8A8_UNORM) {
      VVar11 = VK_FORMAT_B8G8R8A8_UNORM;
    }
    else if (VVar11 == VK_FORMAT_R8G8B8A8_SRGB) {
      VVar11 = VK_FORMAT_B8G8R8A8_SRGB;
    }
    else if (VVar11 == VK_FORMAT_B8G8R8A8_SRGB) {
      VVar11 = VK_FORMAT_R8G8B8A8_SRGB;
    }
    else if (VVar11 == VK_FORMAT_B8G8R8A8_UNORM) {
      VVar11 = VK_FORMAT_R8G8B8A8_UNORM;
    }
    else {
      VVar11 = VK_FORMAT_UNDEFINED;
    }
    for (; SupportedFormats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_start !=
           SupportedFormats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_finish;
        SupportedFormats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start =
             SupportedFormats.
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      if ((SupportedFormats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_start)->format == VVar11) {
        VVar17 = (SupportedFormats.
                  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                  _M_impl.super__Vector_impl_data._M_start)->colorSpace;
        this->m_VkColorFormat = VVar11;
        Format = VkFormatToTexFormat(VVar11);
        pTVar14 = GetTextureFormatAttribs
                            ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                             ColorBufferFormat);
        in_R8 = (char *)GetTextureFormatAttribs(Format);
        FormatString<char[31],char_const*,char[60],char_const*>
                  (&msg,(Diligent *)"Requested color buffer format ",(char (*) [31])pTVar14,
                   (char **)" is not supported by the surface and will be replaced with ",
                   (char (*) [60])in_R8,(char **)in_R9);
        if (DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0);
        }
        std::__cxx11::string::~string((string *)&msg);
        (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.ColorBufferFormat =
             Format;
        goto LAB_00249415;
      }
    }
    pTVar14 = GetTextureFormatAttribs
                        ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                         ColorBufferFormat);
    FormatString<char[31],char_const*,char[32]>
              (&msg,(Diligent *)"Requested color buffer format ",(char (*) [31])pTVar14,
               (char **)"is not supported by the surface",(char (*) [32])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  VVar17 = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
LAB_00249415:
  surfCapabilities.maxImageArrayLayers = 0;
  surfCapabilities.supportedTransforms = 0;
  surfCapabilities.currentTransform = 0;
  surfCapabilities.supportedCompositeAlpha = 0;
  surfCapabilities.supportedUsageFlags = 0;
  surfCapabilities.minImageExtent.width = 0;
  surfCapabilities.minImageExtent.height = 0;
  surfCapabilities.maxImageExtent.width = 0;
  surfCapabilities.maxImageExtent.height = 0;
  surfCapabilities.minImageCount = 0;
  surfCapabilities.maxImageCount = 0;
  surfCapabilities.currentExtent.width = 0;
  surfCapabilities.currentExtent.height = 0;
  VVar10 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)(pVVar4,this->m_VkSurface,&surfCapabilities);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_R8 = "Failed to query physical device surface capabilities";
    in_stack_fffffffffffffcd8 = pVVar24;
    LogError<true,char[53],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf3,(char (*) [53])"Failed to query physical device surface capabilities",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
  }
  presentModeCount = 0;
  Args_1_01 = (char (*) [21])0x0;
  VVar10 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar4,this->m_VkSurface,&presentModeCount,(VkPresentModeKHR *)0x0);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_R8 = "Failed to query surface present mode count";
    Args_1_01 = (char (*) [21])0xf8;
    LogError<true,char[43],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf8,(char (*) [43])"Failed to query surface present mode count",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
    in_stack_fffffffffffffcd8 = pVVar24;
  }
  if (presentModeCount == 0) {
    FormatString<char[26],char[21]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"presentModeCount > 0",
               Args_1_01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf9);
    std::__cxx11::string::~string((string *)&msg);
  }
  pVVar24 = (VkSurfaceCapabilitiesKHR *)&msg;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            (&presentModes,(ulong)presentModeCount,(allocator_type *)pVVar24);
  VVar10 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar4,this->m_VkSurface,&presentModeCount,
                      presentModes.
                      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_R8 = "Failed to query surface present modes";
    LogError<true,char[38],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfc,(char (*) [38])"Failed to query surface present modes",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
    in_stack_fffffffffffffcd8 = pVVar24;
  }
  Args_1_02 = (char (*) [164])
              ((long)presentModes.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)presentModes.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_start >> 2);
  if (Args_1_02 != (char (*) [164])(ulong)presentModeCount) {
    FormatString<char[26],char[40]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount == presentModes.size()",(char (*) [40])Args_1_02);
    Args_1_02 = (char (*) [164])0xfd;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfd);
    std::__cxx11::string::~string((string *)&msg);
  }
  SVar13 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
  if (SVar13 != SURFACE_TRANSFORM_OPTIMAL) {
    VVar12 = SurfaceTransformToVkSurfaceTransformFlag(SVar13);
    if ((surfCapabilities.supportedTransforms & VVar12) == 0) {
      PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)GetSurfaceTransformString
                              ((this->super_SwapChainBase<Diligent::ISwapChainVk>).
                               m_DesiredPreTransform);
      FormatString<char_const*,char[164]>
                (&msg,(Diligent *)&PreferredPresentModes,
                 (char **)
                 " is not supported by the presentation engine. Optimal surface transform will be used instead. Query the swap chain description to get the actual surface transform."
                 ,Args_1_02);
      if (DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform =
           SURFACE_TRANSFORM_OPTIMAL;
    }
    else {
      SVar13 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar13;
      if (SVar13 != SURFACE_TRANSFORM_OPTIMAL) goto LAB_002496f3;
    }
  }
  VVar12 = surfCapabilities.currentTransform;
  SVar13 = VkSurfaceTransformFlagToSurfaceTransform(surfCapabilities.currentTransform);
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar13;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)GetSurfaceTransformString(SVar13);
  FormatString<char[7],char_const*,char[25]>
            (&msg,(Diligent *)"Using ",(char (*) [7])&PreferredPresentModes,
             (char **)" swap chain pretransform",(char (*) [25])in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    in_R8 = (char *)0x0;
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_002496f3:
  uVar21 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
  if ((uVar21 == 0 || surfCapabilities.currentExtent.width != 0xffffffff) ||
     (uVar3 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height, uVar3 == 0
     )) {
    VVar20 = surfCapabilities.currentExtent;
    uVar21 = surfCapabilities.currentExtent.height;
  }
  else {
    uVar8 = surfCapabilities.minImageExtent.width;
    if (surfCapabilities.minImageExtent.width < uVar21) {
      uVar8 = uVar21;
    }
    if (surfCapabilities.maxImageExtent.width < uVar8) {
      uVar8 = surfCapabilities.maxImageExtent.width;
    }
    VVar20.height = 0;
    VVar20.width = uVar8;
    uVar21 = surfCapabilities.minImageExtent.height;
    if (surfCapabilities.minImageExtent.height < uVar3) {
      uVar21 = uVar3;
    }
    if (surfCapabilities.maxImageExtent.height < uVar21) {
      uVar21 = surfCapabilities.maxImageExtent.height;
    }
  }
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width =
       VVar20.width + (uint)(VVar20.width == 0);
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height =
       uVar21 + (uVar21 == 0);
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_300 = (vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               *)CONCAT44(local_300._4_4_,VVar17);
  local_308 = (vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               *)CONCAT44(local_308._4_4_,VVar12);
  if (this->m_VSyncEnabled == true) {
    msg._M_dataplus._M_p._0_4_ = 3;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
              (&PreferredPresentModes,(VkPresentModeKHR *)&msg);
    msg._M_dataplus._M_p._0_4_ = 2;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
              (&PreferredPresentModes,(VkPresentModeKHR *)&msg);
  }
  else {
    msg._M_dataplus._M_p._0_4_ = 1;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
              (&PreferredPresentModes,(VkPresentModeKHR *)&msg);
    msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
              (&PreferredPresentModes,(VkPresentModeKHR *)&msg);
    msg._M_dataplus._M_p._0_4_ = 2;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::emplace_back<VkPresentModeKHR>
              (&PreferredPresentModes,(VkPresentModeKHR *)&msg);
  }
  pVVar9 = PreferredPresentModes.
           super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_318._0_4_ = 1;
  pVVar22 = PreferredPresentModes.
            super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pVVar22 == pVVar9) goto switchD_0024988b_caseD_2;
    msg._M_dataplus._M_p._0_4_ = *pVVar22;
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<VkPresentModeKHR*,std::vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>>>,__gnu_cxx::__ops::_Iter_equals_val<VkPresentModeKHR_const>>
                       (presentModes.
                        super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        presentModes.
                        super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&msg);
    pVVar22 = pVVar22 + 1;
  } while (_Var15._M_current ==
           presentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish);
  switch((ulong)msg._M_dataplus._M_p & 0xffffffff) {
  case 0:
    Name._M_dataplus._M_p = "VK_PRESENT_MODE_IMMEDIATE_KHR";
    local_318._0_4_ = 0;
    break;
  case 1:
    Name._M_dataplus._M_p = "VK_PRESENT_MODE_MAILBOX_KHR";
    break;
  case 2:
switchD_0024988b_caseD_2:
    Name._M_dataplus._M_p = "VK_PRESENT_MODE_FIFO_KHR";
    local_318._0_4_ = 2;
    break;
  case 3:
    Name._M_dataplus._M_p = "VK_PRESENT_MODE_FIFO_RELAXED_KHR";
    local_318._0_4_ = 3;
    break;
  default:
    if ((VkPresentModeKHR)msg._M_dataplus._M_p == 0x3b9c7b98) {
      Name._M_dataplus._M_p = "VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR";
      local_318._0_4_ = 0x3b9c7b98;
    }
    else if ((VkPresentModeKHR)msg._M_dataplus._M_p == 0x3b9c7b99) {
      Name._M_dataplus._M_p = "VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR";
      local_318._0_4_ = 0x3b9c7b99;
    }
    else {
      Name._M_dataplus._M_p = "<UNKNOWN>";
      local_318._0_4_ = (VkPresentModeKHR)msg._M_dataplus._M_p;
    }
  }
  FormatString<char[7],char_const*,char[25]>
            (&msg,(Diligent *)"Using ",(char (*) [7])&Name,(char **)" swap chain present mode",
             (char (*) [25])in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
  }
  pVVar24 = (VkSurfaceCapabilitiesKHR *)&msg;
  std::__cxx11::string::~string((string *)pVVar24);
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
            (&PreferredPresentModes.
              super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
  pUVar1 = &this->m_DesiredBufferCount;
  uVar21 = this->m_DesiredBufferCount;
  if (this->m_DesiredBufferCount < surfCapabilities.minImageCount) {
    in_stack_fffffffffffffcd8 = &surfCapabilities;
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              (&msg,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is smaller than the minimal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcd8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcd8,
               (uint *)CONCAT44(formatCount,swapchainImageCount));
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    *pUVar1 = surfCapabilities.minImageCount;
    uVar21 = surfCapabilities.minImageCount;
  }
  if (surfCapabilities.maxImageCount < uVar21 && surfCapabilities.maxImageCount != 0) {
    in_stack_fffffffffffffcd8 = (VkSurfaceCapabilitiesKHR *)&surfCapabilities.maxImageCount;
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              (&msg,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is greater than the maximal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcd8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcd8,
               (uint *)CONCAT44(formatCount,swapchainImageCount));
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    *pUVar1 = surfCapabilities.maxImageCount;
  }
  lVar19 = 0;
  do {
    if (lVar19 == 0x10) break;
    puVar2 = (uint *)((long)&DAT_005cd660 + lVar19);
    lVar19 = lVar19 + 4;
  } while ((*puVar2 & surfCapabilities.supportedCompositeAlpha) == 0);
  pVVar5 = this->m_VkSwapChain;
  this->m_VkSwapChain = (VkSwapchainKHR)0x0;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PreferredPresentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3b9acde8;
  if ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage ==
      SWAP_CHAIN_USAGE_NONE) {
    FormatString<char[34]>(&msg,(char (*) [34])"No swap chain usage flags defined");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1b4);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_318 = (local_2f8->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  pVVar6 = local_318->m_VkDevice;
  VVar10 = (*vkCreateSwapchainKHR)
                     (pVVar6,(VkSwapchainCreateInfoKHR *)&PreferredPresentModes,
                      (VkAllocationCallbacks *)0x0,&this->m_VkSwapChain);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    in_stack_fffffffffffffcd8 = pVVar24;
    LogError<true,char[34],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1d3,(char (*) [34])"Failed to create Vulkan swapchain",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
  }
  if (pVVar5 != (VkSwapchainKHR)0x0) {
    (*vkDestroySwapchainKHR)(pVVar6,pVVar5,(VkAllocationCallbacks *)0x0);
  }
  swapchainImageCount = 0;
  Args_1_03 = (char (*) [24])0x0;
  VVar10 = (*vkGetSwapchainImagesKHR)
                     (pVVar6,this->m_VkSwapChain,&swapchainImageCount,(VkImage *)0x0);
  if (VVar10 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar10);
    Args_1_03 = (char (*) [24])0x1de;
    LogError<true,char[41],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1de,(char (*) [41])"Failed to request swap chain image count",
               (char (*) [17])"\nVK Error Code: ",(char **)pVVar24);
    in_stack_fffffffffffffcd8 = pVVar24;
  }
  if (swapchainImageCount == 0) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount > 0",Args_1_03);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1df);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (swapchainImageCount !=
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount) {
    pUVar1 = &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
    FormatString<char[25],unsigned_int,char[12],unsigned_int,char[12]>
              (&msg,(Diligent *)"Created swap chain with ",(char (*) [25])&swapchainImageCount,
               (uint *)" images vs ",(char (*) [12])pUVar1,(uint *)0x5f3b4f,
               (char (*) [12])in_stack_fffffffffffffcd8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    *pUVar1 = swapchainImageCount;
  }
  local_300 = &this->m_ImageAcquiredSemaphores;
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(local_300,(ulong)swapchainImageCount);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(&this->m_DrawCompleteSemaphores,(ulong)swapchainImageCount);
  lVar19 = 0;
  local_308 = &this->m_DrawCompleteSemaphores;
  for (uVar23 = 0; uVar23 < swapchainImageCount; uVar23 = uVar23 + 1) {
    local_1e8.pNext = (void *)0x0;
    local_1e8.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
    local_1e8._4_4_ = 0;
    local_1e8.flags = 0;
    local_1e8._20_4_ = 0;
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar16 = std::operator<<((ostream *)msg.field_2._M_local_buf,
                              "Swap chain image acquired semaphore ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::__cxx11::stringbuf::str();
    VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
              (&Semaphore,local_318,&local_1e8,Name._M_dataplus._M_p);
    pRVar7 = (local_300->
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2d0.NewRawPtr =
         *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
           **)((long)&pRVar7->m_pObject + lVar19);
    local_2d0.m_pAutoPtr =
         (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
          *)((long)&pRVar7->m_pObject + lVar19);
    ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
    ::Create(local_2f8,&Semaphore,Name._M_dataplus._M_p,&local_2d0.NewRawPtr);
    RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
    ::
    DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
    ::~DoublePtrHelper(&local_2d0);
    VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
    ~VulkanObjectWrapper(&Semaphore);
    std::__cxx11::string::~string((string *)&Name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar16 = std::operator<<((ostream *)msg.field_2._M_local_buf,
                              "Swap chain draw complete semaphore ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::__cxx11::stringbuf::str();
    VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
              (&Semaphore,local_318,&local_1e8,Name._M_dataplus._M_p);
    pRVar7 = (local_308->
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2d0.NewRawPtr =
         *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
           **)((long)&pRVar7->m_pObject + lVar19);
    local_2d0.m_pAutoPtr =
         (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
          *)((long)&pRVar7->m_pObject + lVar19);
    ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
    ::Create(local_2f8,&Semaphore,Name._M_dataplus._M_p,&local_2d0.NewRawPtr);
    RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
    ::
    DoublePtrHelper<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
    ::~DoublePtrHelper(&local_2d0);
    VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
    ~VulkanObjectWrapper(&Semaphore);
    std::__cxx11::string::~string((string *)&Name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
    lVar19 = lVar19 + 8;
  }
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
            (&presentModes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
  std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
            (&SupportedFormats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
  return;
}

Assistant:

void SwapChainVkImpl::CreateVulkanSwapChain()
{
    RenderDeviceVkImpl*                          pRenderDeviceVk = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    VkPhysicalDevice                             vkDeviceHandle  = PhysicalDevice.GetVkDeviceHandle();
    // Get the list of VkFormats that are supported:
    uint32_t formatCount = 0;

    VkResult err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query number of supported formats");
    VERIFY_EXPR(formatCount > 0);
    std::vector<VkSurfaceFormatKHR> SupportedFormats(formatCount);
    err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, SupportedFormats.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query supported format properties");
    VERIFY_EXPR(formatCount == SupportedFormats.size());
    m_VkColorFormat = TexFormatToVkFormat(m_SwapChainDesc.ColorBufferFormat);

    VkColorSpaceKHR ColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    if (formatCount == 1 && SupportedFormats[0].format == VK_FORMAT_UNDEFINED)
    {
        // If the format list includes just one entry of VK_FORMAT_UNDEFINED,
        // the surface has no preferred format.  Otherwise, at least one
        // supported format will be returned.

        // Do nothing
    }
    else
    {
        bool FmtFound = false;
        for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
        {
            if (SrfFmt.format == m_VkColorFormat)
            {
                FmtFound   = true;
                ColorSpace = SrfFmt.colorSpace;
                break;
            }
        }
        if (!FmtFound)
        {
            VkFormat VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
            switch (m_VkColorFormat)
            {
                    // clang-format off
                case VK_FORMAT_R8G8B8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_SRGB;  break;
                case VK_FORMAT_R8G8B8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_SRGB;  break;
                default: VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
                    // clang-format on
            }

            bool ReplacementFmtFound = false;
            for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
            {
                if (SrfFmt.format == VkReplacementColorFormat)
                {
                    ReplacementFmtFound = true;
                    ColorSpace          = SrfFmt.colorSpace;
                    break;
                }
            }

            if (ReplacementFmtFound)
            {
                m_VkColorFormat                     = VkReplacementColorFormat;
                TEXTURE_FORMAT NewColorBufferFormat = VkFormatToTexFormat(VkReplacementColorFormat);
                LOG_INFO_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, " is not supported by the surface and will be replaced with ", GetTextureFormatAttribs(NewColorBufferFormat).Name);
                m_SwapChainDesc.ColorBufferFormat = NewColorBufferFormat;
            }
            else
            {
                LOG_WARNING_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, "is not supported by the surface");
            }
        }
    }

    VkSurfaceCapabilitiesKHR surfCapabilities = {};

    err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query physical device surface capabilities");

    uint32_t presentModeCount = 0;

    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present mode count");
    VERIFY_EXPR(presentModeCount > 0);
    std::vector<VkPresentModeKHR> presentModes(presentModeCount);
    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, presentModes.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present modes");
    VERIFY_EXPR(presentModeCount == presentModes.size());


    VkSurfaceTransformFlagBitsKHR vkPreTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL)
    {
        vkPreTransform = SurfaceTransformToVkSurfaceTransformFlag(m_DesiredPreTransform);
        if ((surfCapabilities.supportedTransforms & vkPreTransform) != 0)
        {
            m_SwapChainDesc.PreTransform = m_DesiredPreTransform;
        }
        else
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                                " is not supported by the presentation engine. Optimal surface transform will be used instead."
                                " Query the swap chain description to get the actual surface transform.");
            m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
        }
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        // Use current surface transform to avoid extra cost of presenting the image.
        // If preTransform does not match the currentTransform value returned by vkGetPhysicalDeviceSurfaceCapabilitiesKHR,
        // the presentation engine will transform the image content as part of the presentation operation.
        // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/appropriate-use-of-surface-rotation
        vkPreTransform               = surfCapabilities.currentTransform;
        m_SwapChainDesc.PreTransform = VkSurfaceTransformFlagToSurfaceTransform(vkPreTransform);
        LOG_INFO_MESSAGE("Using ", GetSurfaceTransformString(m_SwapChainDesc.PreTransform), " swap chain pretransform");
    }

    VkExtent2D swapchainExtent = {};
    // width and height are either both 0xFFFFFFFF, or both not 0xFFFFFFFF.
    if (surfCapabilities.currentExtent.width == 0xFFFFFFFF && m_SwapChainDesc.Width != 0 && m_SwapChainDesc.Height != 0)
    {
        // If the surface size is undefined, the size is set to
        // the size of the images requested.
        swapchainExtent.width  = std::min(std::max(m_SwapChainDesc.Width, surfCapabilities.minImageExtent.width), surfCapabilities.maxImageExtent.width);
        swapchainExtent.height = std::min(std::max(m_SwapChainDesc.Height, surfCapabilities.minImageExtent.height), surfCapabilities.maxImageExtent.height);
    }
    else
    {
        // If the surface size is defined, the swap chain size must match
        swapchainExtent = surfCapabilities.currentExtent;
    }

#if PLATFORM_ANDROID
    // On Android, vkGetPhysicalDeviceSurfaceCapabilitiesKHR is not reliable and starts reporting incorrect
    // dimensions after few rotations. To alleviate the problem, we store the surface extent corresponding to
    // identity rotation.
    // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
    if (m_SurfaceIdentityExtent.width == 0 || m_SurfaceIdentityExtent.height == 0)
    {
        m_SurfaceIdentityExtent = surfCapabilities.currentExtent;
        constexpr auto Rotate90TransformFlags =
            VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;
        if ((surfCapabilities.currentTransform & Rotate90TransformFlags) != 0)
            std::swap(m_SurfaceIdentityExtent.width, m_SurfaceIdentityExtent.height);
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        swapchainExtent = m_SurfaceIdentityExtent;
    }
    m_CurrentSurfaceTransform = surfCapabilities.currentTransform;
#endif

    swapchainExtent.width  = std::max(swapchainExtent.width, 1u);
    swapchainExtent.height = std::max(swapchainExtent.height, 1u);
    m_SwapChainDesc.Width  = swapchainExtent.width;
    m_SwapChainDesc.Height = swapchainExtent.height;

    // The FIFO present mode is guaranteed by the spec to always be supported.
    VkPresentModeKHR PresentMode = VK_PRESENT_MODE_FIFO_KHR;
    {
        std::vector<VkPresentModeKHR> PreferredPresentModes;
        if (m_VSyncEnabled)
        {
            // FIFO relaxed waits for the next VSync, but if the frame is late,
            // it still shows it even if VSync has already passed, which may
            // result in tearing.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_RELAXED_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }
        else
        {
            // Mailbox is the lowest latency non-tearing presentation mode.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_IMMEDIATE_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }

        for (VkPresentModeKHR PreferredMode : PreferredPresentModes)
        {
            if (std::find(presentModes.begin(), presentModes.end(), PreferredMode) != presentModes.end())
            {
                PresentMode = PreferredMode;
                break;
            }
        }

        const char* PresentModeName = nullptr;
#define PRESENT_MODE_CASE(Mode) \
    case Mode: PresentModeName = #Mode; break;
        switch (PresentMode)
        {
            PRESENT_MODE_CASE(VK_PRESENT_MODE_IMMEDIATE_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_MAILBOX_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_RELAXED_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR)
            default: PresentModeName = "<UNKNOWN>";
        }
#undef PRESENT_MODE_CASE
        LOG_INFO_MESSAGE("Using ", PresentModeName, " swap chain present mode");
    }

    // Determine the number of VkImage's to use in the swap chain.
    // We need to acquire only 1 presentable image at at time.
    // Asking for minImageCount images ensures that we can acquire
    // 1 presentable image as long as we present it before attempting
    // to acquire another.
    if (m_DesiredBufferCount < surfCapabilities.minImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is smaller than the minimal image count supported for this surface (", surfCapabilities.minImageCount, "). Resetting to ", surfCapabilities.minImageCount);
        m_DesiredBufferCount = surfCapabilities.minImageCount;
    }
    if (surfCapabilities.maxImageCount != 0 && m_DesiredBufferCount > surfCapabilities.maxImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is greater than the maximal image count supported for this surface (", surfCapabilities.maxImageCount, "). Resetting to ", surfCapabilities.maxImageCount);
        m_DesiredBufferCount = surfCapabilities.maxImageCount;
    }
    // We must use m_DesiredBufferCount instead of m_SwapChainDesc.BufferCount, because Vulkan on Android
    // may decide to always add extra buffers, causing infinite growth of the swap chain when it is recreated:
    //                          m_SwapChainDesc.BufferCount
    // CreateVulkanSwapChain()          2 -> 4
    // CreateVulkanSwapChain()          4 -> 6
    // CreateVulkanSwapChain()          6 -> 8
    uint32_t desiredNumberOfSwapChainImages = m_DesiredBufferCount;

    // Find a supported composite alpha mode - one of these is guaranteed to be set
    VkCompositeAlphaFlagBitsKHR compositeAlpha         = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    VkCompositeAlphaFlagBitsKHR compositeAlphaFlags[4] = //
        {
            VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR,
            VK_COMPOSITE_ALPHA_PRE_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_POST_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_INHERIT_BIT_KHR,
        };
    for (uint32_t i = 0; i < _countof(compositeAlphaFlags); i++)
    {
        if (surfCapabilities.supportedCompositeAlpha & compositeAlphaFlags[i])
        {
            compositeAlpha = compositeAlphaFlags[i];
            break;
        }
    }

    VkSwapchainKHR oldSwapchain = m_VkSwapChain;
    m_VkSwapChain               = VK_NULL_HANDLE;

    VkSwapchainCreateInfoKHR swapchain_ci = {};

    swapchain_ci.sType              = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    swapchain_ci.pNext              = NULL;
    swapchain_ci.surface            = m_VkSurface;
    swapchain_ci.minImageCount      = desiredNumberOfSwapChainImages;
    swapchain_ci.imageFormat        = m_VkColorFormat;
    swapchain_ci.imageExtent.width  = swapchainExtent.width;
    swapchain_ci.imageExtent.height = swapchainExtent.height;
    swapchain_ci.preTransform       = vkPreTransform;
    swapchain_ci.compositeAlpha     = compositeAlpha;
    swapchain_ci.imageArrayLayers   = 1;
    swapchain_ci.presentMode        = PresentMode;
    swapchain_ci.oldSwapchain       = oldSwapchain;
    swapchain_ci.clipped            = VK_TRUE;
    swapchain_ci.imageColorSpace    = ColorSpace;

    DEV_CHECK_ERR(m_SwapChainDesc.Usage != 0, "No swap chain usage flags defined");
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Please update this function to handle the new swapchain usage");
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_RENDER_TARGET)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_SHADER_RESOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_SAMPLED_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_COPY_SOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

    // vkCmdClearColorImage() command requires the image to use VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL layout
    // that requires  VK_IMAGE_USAGE_TRANSFER_DST_BIT to be set
    swapchain_ci.imageSharingMode      = VK_SHARING_MODE_EXCLUSIVE;
    swapchain_ci.queueFamilyIndexCount = 0;
    swapchain_ci.pQueueFamilyIndices   = NULL;
    //uint32_t queueFamilyIndices[] = { (uint32_t)info.graphics_queue_family_index, (uint32_t)info.present_queue_family_index };
    //if (info.graphics_queue_family_index != info.present_queue_family_index) {
    //    // If the graphics and present queues are from different queue families,
    //    // we either have to explicitly transfer ownership of images between
    //    // the queues, or we have to create the swapchain with imageSharingMode
    //    // as VK_SHARING_MODE_CONCURRENT
    //    swapchain_ci.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    //    swapchain_ci.queueFamilyIndexCount = 2;
    //    swapchain_ci.pQueueFamilyIndices = queueFamilyIndices;
    //}

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = pRenderDeviceVk->GetLogicalDevice();
    VkDevice                                    vkDevice      = pRenderDeviceVk->GetVkDevice();

    err = vkCreateSwapchainKHR(vkDevice, &swapchain_ci, NULL, &m_VkSwapChain);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan swapchain");

    if (oldSwapchain != VK_NULL_HANDLE)
    {
        vkDestroySwapchainKHR(vkDevice, oldSwapchain, NULL);
        oldSwapchain = VK_NULL_HANDLE;
    }

    uint32_t swapchainImageCount = 0;

    err = vkGetSwapchainImagesKHR(vkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to request swap chain image count");
    VERIFY_EXPR(swapchainImageCount > 0);
    if (swapchainImageCount != m_SwapChainDesc.BufferCount)
    {
        LOG_INFO_MESSAGE("Created swap chain with ", swapchainImageCount,
                         " images vs ", m_SwapChainDesc.BufferCount, " requested.");
        m_SwapChainDesc.BufferCount = swapchainImageCount;
    }

    m_ImageAcquiredSemaphores.resize(swapchainImageCount);
    m_DrawCompleteSemaphores.resize(swapchainImageCount);
    for (uint32_t i = 0; i < swapchainImageCount; ++i)
    {
        VkSemaphoreCreateInfo SemaphoreCI = {};

        SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
        SemaphoreCI.pNext = nullptr;
        SemaphoreCI.flags = 0; // reserved for future use

        {
            std::stringstream ss;
            ss << "Swap chain image acquired semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_ImageAcquiredSemaphores[i]);
        }

        {
            std::stringstream ss;
            ss << "Swap chain draw complete semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_DrawCompleteSemaphores[i]);
        }
    }
}